

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitIfStart
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,If *iff,Name label,
          Type inputType)

{
  Type inputType_00;
  bool bVar1;
  Name originalLabel;
  ScopeCtx local_150;
  uint local_9c;
  Err local_98;
  Err *local_68;
  Err *err;
  Result<wasm::Ok> _val;
  If *iff_local;
  IRBuilder *this_local;
  Type inputType_local;
  Name label_local;
  
  inputType_00.id = inputType.id;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = iff;
  applyDebugLoc(this,(Expression *)iff);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitIf
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,
             (If *)_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
  local_68 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar1 = local_68 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_98,local_68);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_98);
    wasm::Err::~Err(&local_98);
  }
  local_9c = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_9c == 0) {
    originalLabel.super_IString.str._M_str = (char *)inputType.id;
    originalLabel.super_IString.str._M_len = (size_t)label.super_IString.str._M_str;
    ScopeCtx::makeIf(&local_150,
                     (ScopeCtx *)
                     _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,
                     label.super_IString.str._M_len,originalLabel,inputType_00);
    pushScope(__return_storage_ptr__,this,&local_150);
    ScopeCtx::~ScopeCtx(&local_150);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitIfStart(If* iff, Name label, Type inputType) {
  applyDebugLoc(iff);
  CHECK_ERR(visitIf(iff));
  return pushScope(ScopeCtx::makeIf(iff, label, inputType));
}